

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O3

bool google::protobuf::compiler::cpp::CanInitializeByZeroing(FieldDescriptor *field)

{
  bool bVar1;
  EnumValueDescriptor *pEVar2;
  byte bVar3;
  FieldDescriptor *local_18;
  _func_void_FieldDescriptor_ptr *local_10;
  
  if (((byte)field[1] & 8) != 0 || (~(byte)field[1] & 0x60) == 0) {
    return false;
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_10 = FieldDescriptor::TypeOnceInit;
    local_18 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),&local_10,&local_18);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4)) {
  case 1:
  case 3:
    bVar3 = *(int *)(field + 0x40) == 0;
    break;
  case 2:
  case 4:
    bVar3 = *(long *)(field + 0x40) == 0;
    break;
  case 5:
    bVar1 = *(double *)(field + 0x40) == 0.0;
    goto LAB_0023a50e;
  case 6:
    bVar1 = *(float *)(field + 0x40) == 0.0;
LAB_0023a50e:
    bVar3 = -bVar1 & 1;
    break;
  case 7:
    bVar3 = (byte)field[0x40] ^ 1;
    break;
  case 8:
    pEVar2 = FieldDescriptor::default_value_enum(field);
    bVar3 = *(int *)(pEVar2 + 4) == 0;
    break;
  default:
    bVar3 = 0;
  }
  return (bool)bVar3;
}

Assistant:

inline FieldDescriptor::Label FieldDescriptor::label() const {
  return static_cast<Label>(label_);
}